

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_push_back(void)

{
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  uint uVar1;
  size_type sVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_4UL> span;
  int array [4];
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  circular_view<int,_4UL> *local_60;
  ulong uStack_58;
  circular_view<int,_4UL> local_50;
  int local_38 [4];
  type local_28 [6];
  
  local_50.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_4UL>::assign(&local_50,input);
  uVar1 = (uint)local_50.member.next;
  local_50.member.next = (ulong)(uVar1 + 1 & 3) | 4;
  sVar2 = local_50.member.size + 1;
  if (local_50.member.size == 4) {
    sVar2 = 4;
  }
  local_50.member.size = sVar2;
  if (sVar2 != 0) {
    local_50.member.data[uVar1 & 3] = 0x2c;
    local_38[0] = 0xb;
    local_38[1] = 0x16;
    local_38[2] = 0x21;
    local_38[3] = 0x2c;
    __l._M_len = 4;
    __l._M_array = local_38;
    std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_79);
    first_begin.current._0_4_ = (uint)local_50.member.next - (int)local_50.member.size & 7;
    uVar1 = (uint)local_50.member.next & 7;
    uStack_58 = (ulong)uVar1;
    second_end._M_current._4_4_ =
         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish._4_4_;
    second_end._M_current._0_4_ =
         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    first_end.current._0_4_ = uVar1;
    first_end.parent = &local_50;
    first_end.current._4_4_ = 0;
    first_begin.parent = &local_50;
    first_begin.current._4_4_ = 0;
    local_60 = &local_50;
    boost::detail::
    test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
               ,0x3de,"void api_fixed_suite::fixed_push_back()",first_begin,first_end,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,second_end);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x80,"reference vista::circular_view<int, 4>::back() [T = int, Extent = 4]");
}

Assistant:

void fixed_push_back()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33};
    span.push_back(44);
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}